

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RangeStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_rangestatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  RangeStaticLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_rangestatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_rangestatic(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::RangeStaticLayerParams>(arena);
    (this->layer_).rangestatic_ = pRVar2;
  }
  return (RangeStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RangeStaticLayerParams* NeuralNetworkLayer::_internal_mutable_rangestatic() {
  if (!_internal_has_rangestatic()) {
    clear_layer();
    set_has_rangestatic();
    layer_.rangestatic_ = CreateMaybeMessage< ::CoreML::Specification::RangeStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.rangestatic_;
}